

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O0

void Cec_GiaSplitPrint(int nIter,int Depth,int nVars,int nConfs,int fStatus,double Prog,abctime clk)

{
  char *local_38;
  abctime clk_local;
  double Prog_local;
  int fStatus_local;
  int nConfs_local;
  int nVars_local;
  int Depth_local;
  int nIter_local;
  
  printf("%4d : ",(ulong)(uint)nIter);
  printf("Depth =%3d  ",(ulong)(uint)Depth);
  printf("SatVar =%7d  ",(ulong)(uint)nVars);
  printf("SatConf =%7d   ",(ulong)(uint)nConfs);
  if (fStatus == 0) {
    local_38 = "SAT      ";
  }
  else {
    local_38 = "UNDECIDED";
    if (fStatus == 1) {
      local_38 = "UNSAT    ";
    }
  }
  printf("%s   ",local_38);
  printf("Solved %8.4f %%   ",Prog * 100.0);
  Abc_PrintTime(1,"Time",clk);
  fflush(_stdout);
  return;
}

Assistant:

void Cec_GiaSplitPrint( int nIter, int Depth, int nVars, int nConfs, int fStatus, double Prog, abctime clk )
{
    printf( "%4d : ",             nIter );
    printf( "Depth =%3d  ",       Depth );
    printf( "SatVar =%7d  ",      nVars );
    printf( "SatConf =%7d   ",    nConfs );
    printf( "%s   ",              fStatus ? (fStatus == 1 ? "UNSAT    " : "UNDECIDED") : "SAT      " );
    printf( "Solved %8.4f %%   ", 100*Prog );
    Abc_PrintTime( 1, "Time", clk );
    //ABC_PRTr( "Time", Abc_Clock()-clk );
    fflush( stdout );
}